

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O1

void __thiscall slang::ast::builtins::SdfAnnotateTask::SdfAnnotateTask(SdfAnnotateTask *this)

{
  long *local_38;
  long local_30;
  long local_28 [2];
  
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"$sdf_annotate","");
  (this->super_SystemTaskBase).super_SystemSubroutine._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_004f1bb8;
  (this->super_SystemTaskBase).super_SystemSubroutine.name._M_dataplus._M_p =
       (pointer)&(this->super_SystemTaskBase).super_SystemSubroutine.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_SystemTaskBase).super_SystemSubroutine.name,local_38,
             local_30 + (long)local_38);
  (this->super_SystemTaskBase).super_SystemSubroutine.kind = Task;
  (this->super_SystemTaskBase).super_SystemSubroutine.hasOutputArgs = false;
  (this->super_SystemTaskBase).super_SystemSubroutine.withClauseMode = None;
  (this->super_SystemTaskBase).super_SystemSubroutine._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_004f1388;
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  (this->super_SystemTaskBase).super_SystemSubroutine._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_004f18b0;
  return;
}

Assistant:

SdfAnnotateTask() : SystemTaskBase("$sdf_annotate") {}